

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_example.cc
# Opt level: O2

int main(int argc,char **argv)

{
  mapped_type *pmVar1;
  ostream *poVar2;
  iterator iVar3;
  __node_base _Var4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> entry;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  user_name_to_user_id;
  allocator local_89;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_60;
  
  local_60._M_buckets = &local_60._M_single_bucket;
  local_60._M_bucket_count = 1;
  local_60._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_60._M_element_count = 0;
  local_60._M_rehash_policy._M_max_load_factor = 1.0;
  local_60._M_rehash_policy._M_next_resize = 0;
  local_60._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string((string *)&local_88,"victor",&local_89);
  pmVar1 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&local_60,&local_88.first);
  *pmVar1 = 1;
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"john",&local_89);
  pmVar1 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&local_60,&local_88.first);
  *pmVar1 = 2;
  std::__cxx11::string::~string((string *)&local_88);
  for (_Var4._M_nxt = local_60._M_before_begin._M_nxt; _Var4._M_nxt != (_Hash_node_base *)0x0;
      _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt) {
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_true>
              (&local_88,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)(_Var4._M_nxt + 1));
    poVar2 = std::operator<<((ostream *)&std::cout,"Key=");
    poVar2 = std::operator<<(poVar2,(string *)&local_88);
    poVar2 = std::operator<<(poVar2," Value=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_88.second);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_88);
  }
  std::__cxx11::string::string((string *)&local_88,"victor",&local_89);
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_60,&local_88.first);
  std::__cxx11::string::~string((string *)&local_88);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"User name not found.");
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"user_name ");
    poVar2 = std::operator<<(poVar2,(string *)
                                    ((long)iVar3.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                           ._M_cur + 8));
    poVar2 = std::operator<<(poVar2," found, user_id=");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,*(int *)((long)iVar3.
                                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                              ._M_cur + 0x28));
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)&local_88,"aladin",&local_89);
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_60,&local_88.first);
  std::__cxx11::string::~string((string *)&local_88);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"User name not found.");
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"user_name ");
    poVar2 = std::operator<<(poVar2,(string *)
                                    ((long)iVar3.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                           ._M_cur + 8));
    poVar2 = std::operator<<(poVar2," found, user_id=");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,*(int *)((long)iVar3.
                                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                              ._M_cur + 0x28));
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_60);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  // Declaration of a map requires to types, the key and the value.
  std::unordered_map<std::string, int> user_name_to_user_id;
  // The idea of this map is to get the user id given the user name. The map can
  // be viewed as a dictionary (e.g., as in Python).
  // Inserting into the map example.
  int user_id = 1;
  user_name_to_user_id["victor"] = user_id;
  user_name_to_user_id["john"] = ++user_id;
  // When inserting an entry, the key value goes inside the square brackets.
  // The value then is assigned using the = operator. When this operation is
  // successful, the map stores an std::pair<int, std::string> instance. This
  // pair has two members, the first member contains the key, and the second
  // contains the value.
  
  // At this stage this map has two elements. This is how we can iterate the
  // map.
  for (std::pair<std::string, int> entry : user_name_to_user_id) {
    std::cout << "Key=" << entry.first
              << " Value=" << entry.second << std::endl;
  }
  // The range for loop iterates over the pairs in the map, makes a copy into
  // entry at every iteration.

  // Finding elements in the map. Say we want to find the a user name in the
  // map. Very similarly to the set, we will use iterators for this. If the
  // returned iterator is equals to std::map::end() then the entry is not in the
  // map, if it is different, then the entry is in the map.
  std::unordered_map<std::string, int>::iterator iterator =
      user_name_to_user_id.find("victor");
  if (iterator == user_name_to_user_id.end()) {
    std::cout << "User name not found." << std::endl;
  } else {
    std::cout << "user_name " << iterator->first
              << " found, user_id=" << iterator->second << std::endl;
  }
  // Note that the iterator "points" to a std::pair, which its first member is
  // the key and the second member is the value.
  // Let's search for a non-existing entry.
  iterator = user_name_to_user_id.find("aladin");
  if (iterator == user_name_to_user_id.end()) {
    std::cout << "User name not found." << std::endl;
  } else {
    std::cout << "user_name " << iterator->first
              << " found, user_id=" << iterator->second << std::endl;
  }
  return 0;
}